

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

int StrListIndex(tchar_t *s,tchar_t *List)

{
  int iVar1;
  size_t n;
  char *pcVar2;
  int i;
  int iVar3;
  
  if (((List != (tchar_t *)0x0) && (*List != '\0')) && (n = strlen(s), n != 0)) {
    iVar3 = 0;
    do {
      iVar1 = tcsnicmp_ascii(List,s,n);
      if (((iVar1 == 0) && ((ulong)(byte)List[n] < 0x2d)) &&
         ((0x100100000001U >> ((ulong)(byte)List[n] & 0x3f) & 1) != 0)) {
        return iVar3;
      }
      pcVar2 = strchr(List,0x2c);
      List = pcVar2 + 1;
      iVar3 = iVar3 + 1;
    } while (pcVar2 != (char *)0x0);
  }
  return -1;
}

Assistant:

int StrListIndex(const tchar_t* s, const tchar_t* List)
{
	if (List && *List)
	{
		size_t n = tcslen(s);
		if (n)
		{
			int i=0;
			while (List)
			{
				if (tcsnicmp_ascii(List,s,n)==0 && (!List[n] || List[n]==',' || List[n]==' '))
					return i;
				List = tcschr(List,T(','));
				if (List) ++List;
				++i;
			}
		}
	}
	return -1;
}